

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

int Abc_SclComputeReverseLevel(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_20;
  int local_1c;
  int Level;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_ObjFanout(pObj,local_1c);
    local_20 = Abc_MaxInt(local_20,*(uint *)&pAVar2->field_0x14 >> 0xc);
  }
  return local_20 + 1;
}

Assistant:

int Abc_SclComputeReverseLevel( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, Level = 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Level = Abc_MaxInt( Level, pFanout->Level );
    return Level + 1;
}